

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssh-certs.c
# Opt level: O0

void opensshcert_openssh_blob(ssh_key *key,BinarySink *bs)

{
  void *pvVar1;
  strbuf *psVar2;
  undefined1 local_88 [8];
  BlobTransformer bt [1];
  undefined1 local_68 [8];
  BinarySource basesrc [1];
  strbuf *baseossh;
  strbuf *cert;
  opensshcert_extra *extra;
  opensshcert_key *ck;
  BinarySink *bs_local;
  ssh_key *key_local;
  
  pvVar1 = key->vt->extra;
  psVar2 = strbuf_new();
  ssh_key_public_blob(key,psVar2->binarysink_);
  BinarySink_put_stringsb(bs->binarysink_,psVar2);
  psVar2 = strbuf_new_nm();
  ssh_key_openssh_blob((ssh_key *)key[-1].vt,psVar2->binarysink_);
  join_0x00000010_0x00000000_ = ptrlen_from_strbuf(psVar2);
  BinarySource_INIT__((BinarySource *)local_68,join_0x00000010_0x00000000_);
  memset(local_88,0,0x10);
  blobtrans_read((BlobTransformer *)local_88,(BinarySource *)local_68,
                 *(blob_fmt *)((long)pvVar1 + 0x10));
  blobtrans_write((BlobTransformer *)local_88,bs,*(blob_fmt *)((long)pvVar1 + 0x20));
  blobtrans_clear((BlobTransformer *)local_88);
  strbuf_free(psVar2);
  return;
}

Assistant:

static void opensshcert_openssh_blob(ssh_key *key, BinarySink *bs)
{
    opensshcert_key *ck = container_of(key, opensshcert_key, sshk);
    const opensshcert_extra *extra = key->vt->extra;

    strbuf *cert = strbuf_new();
    ssh_key_public_blob(key, BinarySink_UPCAST(cert));
    put_stringsb(bs, cert);

    strbuf *baseossh = strbuf_new_nm();
    ssh_key_openssh_blob(ck->basekey, BinarySink_UPCAST(baseossh));
    BinarySource basesrc[1];
    BinarySource_BARE_INIT_PL(basesrc, ptrlen_from_strbuf(baseossh));

    BLOBTRANS_DECLARE(bt);
    blobtrans_read(bt, basesrc, extra->base_ossh_fmt);
    blobtrans_write(bt, bs, extra->cert_ossh_fmt);
    blobtrans_clear(bt);

    strbuf_free(baseossh);
}